

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

stbtt__buf stbtt__dict_get(stbtt__buf *b,int key)

{
  int o;
  int iVar1;
  byte bVar2;
  stbtt__buf sVar3;
  uint local_30;
  int op;
  int end;
  int start;
  int key_local;
  stbtt__buf *b_local;
  
  stbtt__buf_seek(b,0);
  do {
    if (b->size <= b->cursor) {
      sVar3 = stbtt__buf_range(b,0,0);
      return sVar3;
    }
    o = b->cursor;
    while (bVar2 = stbtt__buf_peek8(b), 0x1b < bVar2) {
      stbtt__cff_skip_operand(b);
    }
    iVar1 = b->cursor;
    bVar2 = stbtt__buf_get8(b);
    local_30 = (uint)bVar2;
    if (local_30 == 0xc) {
      bVar2 = stbtt__buf_get8(b);
      local_30 = bVar2 | 0x100;
    }
  } while (local_30 != key);
  sVar3 = stbtt__buf_range(b,o,iVar1 - o);
  return sVar3;
}

Assistant:

static stbtt__buf stbtt__dict_get(stbtt__buf *b, int key)
{
   stbtt__buf_seek(b, 0);
   while (b->cursor < b->size) {
      int start = b->cursor, end, op;
      while (stbtt__buf_peek8(b) >= 28)
         stbtt__cff_skip_operand(b);
      end = b->cursor;
      op = stbtt__buf_get8(b);
      if (op == 12)  op = stbtt__buf_get8(b) | 0x100;
      if (op == key) return stbtt__buf_range(b, start, end-start);
   }
   return stbtt__buf_range(b, 0, 0);
}